

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_prim.c
# Opt level: O0

void TexturePrimitives(int mode)

{
  int iVar1;
  undefined8 in_RSI;
  int in_EDI;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float y;
  float x;
  ALLEGRO_COLOR color;
  int ii;
  int local_8;
  
  if (in_EDI == 0) {
    for (local_8 = 0; local_8 < 0xd; local_8 = local_8 + 1) {
      fVar2 = cosf(((float)local_8 / 13.0 + (float)local_8 / 13.0) * 3.1415927);
      fVar2 = fVar2 * 200.0;
      fVar3 = sinf(((float)local_8 / 13.0 + (float)local_8 / 13.0) * 3.1415927);
      uVar5 = 0x43480000;
      fVar3 = fVar3 * 200.0;
      iVar1 = (local_8 + 2 + ((local_8 + 2) / 3) * -3) * 0x40;
      uVar4 = al_map_rgb((local_8 + 1 + ((local_8 + 1) / 3) * -3 & 3U) << 6,(char)iVar1,
                         (local_8 % 3 & 3U) << 6,iVar1);
      TexturePrimitives::vtx[local_8].x = fVar2;
      TexturePrimitives::vtx[local_8].y = fVar3;
      TexturePrimitives::vtx[local_8].z = 0.0;
      TexturePrimitives::vtx2[local_8].x = fVar2 * 0.1;
      TexturePrimitives::vtx2[local_8].y = fVar3 * 0.1;
      TexturePrimitives::vtx[local_8].u = (fVar2 * 64.0) / 100.0;
      TexturePrimitives::vtx[local_8].v = (fVar3 * 64.0) / 100.0;
      TexturePrimitives::vtx2[local_8].u = (fVar2 * 64.0) / 100.0;
      TexturePrimitives::vtx2[local_8].v = (fVar3 * 64.0) / 100.0;
      if (local_8 < 10) {
        uVar5 = 0x3f800000;
        uVar4 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000);
        TexturePrimitives::vtx[local_8].color.r = (float)(int)uVar4;
        TexturePrimitives::vtx[local_8].color.g = (float)(int)((ulong)uVar4 >> 0x20);
        TexturePrimitives::vtx[local_8].color.b = (float)(int)uVar5;
        TexturePrimitives::vtx[local_8].color.a = (float)(int)((ulong)uVar5 >> 0x20);
      }
      else {
        TexturePrimitives::vtx[local_8].color.r = (float)(int)uVar4;
        TexturePrimitives::vtx[local_8].color.g = (float)(int)((ulong)uVar4 >> 0x20);
        TexturePrimitives::vtx[local_8].color.b = (float)(int)uVar5;
        TexturePrimitives::vtx[local_8].color.a = (float)(int)((ulong)uVar5 >> 0x20);
      }
      fVar2 = TexturePrimitives::vtx[local_8].color.g;
      TexturePrimitives::vtx2[local_8].color.r = TexturePrimitives::vtx[local_8].color.r;
      TexturePrimitives::vtx2[local_8].color.g = fVar2;
      fVar2 = TexturePrimitives::vtx[local_8].color.a;
      TexturePrimitives::vtx2[local_8].color.b = TexturePrimitives::vtx[local_8].color.b;
      TexturePrimitives::vtx2[local_8].color.a = fVar2;
    }
  }
  else if (in_EDI == 1) {
    Theta = Speed + Theta;
    al_build_transform((float)(ScreenW / 2),(float)(ScreenH / 2),0x3f800000,0x3f800000,Theta,
                       &MainTrans,in_RSI,(long)ScreenH % 2 & 0xffffffff);
  }
  else if (in_EDI == 2) {
    if (Blend == 0) {
      al_set_blender(0,1);
    }
    else {
      al_set_blender(0,1);
    }
    al_use_transform(&MainTrans);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,0,4);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,4,9,1);
    al_draw_prim(TexturePrimitives::vtx,0,Texture,9,0xd,2);
    al_draw_prim(TexturePrimitives::vtx2,0,Texture,0,0xd,6);
    al_use_transform(&Identity);
  }
  return;
}

Assistant:

static void TexturePrimitives(int mode)
{
   static ALLEGRO_VERTEX vtx[13];
   static ALLEGRO_VERTEX vtx2[13];
   if (mode == INIT) {
      int ii = 0;
      ALLEGRO_COLOR color;
      for (ii = 0; ii < 13; ii++) {
         float x, y;
         x = 200 * cosf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         y = 200 * sinf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         
         color = al_map_rgb((ii + 1) % 3 * 64, (ii + 2) % 3 * 64, (ii) % 3 * 64);
         
         vtx[ii].x = x; vtx[ii].y = y; vtx[ii].z = 0;
         vtx2[ii].x = 0.1 * x; vtx2[ii].y = 0.1 * y;
         vtx[ii].u = 64 * x / 100; vtx[ii].v = 64 * y / 100;
         vtx2[ii].u = 64 * x / 100; vtx2[ii].v = 64 * y / 100;
         if(ii < 10)
            vtx[ii].color = al_map_rgba_f(1, 1, 1, 1);
         else
            vtx[ii].color = color;
         vtx2[ii].color = vtx[ii].color;
      }
   } else if (mode == LOGIC) {
      Theta += Speed;
      al_build_transform(&MainTrans, ScreenW / 2, ScreenH / 2, 1, 1, Theta);
   } else if (mode == DRAW) {
      if (Blend)
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ONE);
      else
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      
      al_use_transform(&MainTrans);
      
      al_draw_prim(vtx, 0, Texture, 0, 4, ALLEGRO_PRIM_LINE_LIST);
      al_draw_prim(vtx, 0, Texture, 4, 9, ALLEGRO_PRIM_LINE_STRIP);
      al_draw_prim(vtx, 0, Texture, 9, 13, ALLEGRO_PRIM_LINE_LOOP);
      al_draw_prim(vtx2, 0, Texture, 0, 13, ALLEGRO_PRIM_POINT_LIST);
      
      al_use_transform(&Identity);
   }
}